

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O3

void av1_alloc_tile_data(AV1_COMP *cpi)

{
  undefined8 *puVar1;
  uint uVar2;
  uint uVar3;
  TileDataEnc *pTVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  
  uVar2 = (cpi->common).tiles.cols;
  uVar3 = (cpi->common).tiles.rows;
  av1_row_mt_mem_dealloc(cpi);
  aom_free(cpi->tile_data);
  cpi->allocated_tiles = 0;
  (cpi->mt_info).enc_row_mt.allocated_tile_rows = 0;
  (cpi->mt_info).enc_row_mt.allocated_tile_cols = 0;
  pTVar4 = (TileDataEnc *)aom_memalign(0x20,(long)(int)(uVar3 * uVar2) * 0x5d10);
  cpi->tile_data = pTVar4;
  if (pTVar4 == (TileDataEnc *)0x0) {
    aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate cpi->tile_data");
  }
  cpi->allocated_tiles = uVar3 * uVar2;
  (cpi->mt_info).enc_row_mt.allocated_tile_cols = uVar2;
  (cpi->mt_info).enc_row_mt.allocated_tile_rows = uVar3;
  if (0 < (int)uVar3) {
    lVar5 = 0x5cd8;
    uVar6 = 0;
    do {
      uVar7 = (ulong)uVar2;
      lVar8 = lVar5;
      if (0 < (int)uVar2) {
        do {
          pTVar4 = cpi->tile_data;
          puVar1 = (undefined8 *)((long)(pTVar4->tctx).txb_skip_cdf[0][0] + lVar8);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)((pTVar4->tctx).txb_skip_cdf + -1) + 0x3e + lVar8);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)((pTVar4->tctx).txb_skip_cdf + -1) + 0x2e + lVar8);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined8 *)((long)pTVar4 + lVar8 + -0x9b8) = 0;
          lVar8 = lVar8 + 0x5d10;
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
      }
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + (ulong)uVar2 * 0x5d10;
    } while (uVar6 != uVar3);
  }
  return;
}

Assistant:

void av1_alloc_tile_data(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  AV1EncRowMultiThreadInfo *const enc_row_mt = &cpi->mt_info.enc_row_mt;
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;

  av1_row_mt_mem_dealloc(cpi);

  aom_free(cpi->tile_data);
  cpi->allocated_tiles = 0;
  enc_row_mt->allocated_tile_cols = 0;
  enc_row_mt->allocated_tile_rows = 0;

  CHECK_MEM_ERROR(
      cm, cpi->tile_data,
      aom_memalign(32, tile_cols * tile_rows * sizeof(*cpi->tile_data)));

  cpi->allocated_tiles = tile_cols * tile_rows;
  enc_row_mt->allocated_tile_cols = tile_cols;
  enc_row_mt->allocated_tile_rows = tile_rows;
  for (int tile_row = 0; tile_row < tile_rows; ++tile_row) {
    for (int tile_col = 0; tile_col < tile_cols; ++tile_col) {
      const int tile_index = tile_row * tile_cols + tile_col;
      TileDataEnc *const this_tile = &cpi->tile_data[tile_index];
      av1_zero(this_tile->row_mt_sync);
      this_tile->row_ctx = NULL;
    }
  }
}